

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

expression_ptr __thiscall
mjs::parser::
make_expression<mjs::regexp_literal_expression,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
          (parser *this,basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *args,
          basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *args_1)

{
  wstring_view pattern;
  regexp_literal_expression *this_00;
  wstring_view *in_RCX;
  source_extend local_48;
  undefined1 local_29;
  wstring_view *local_28;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *args_local_1;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *args_local;
  parser *this_local;
  expression_ptr *e;
  
  args_local_1 = args_1;
  args_local = args;
  this_local = this;
  if (args[6]._M_str == (wchar_t *)0x0) {
    __assert_fail("expression_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x13d,
                  "expression_ptr mjs::parser::make_expression(Args &&...) [T = mjs::regexp_literal_expression, Args = <std::basic_string_view<wchar_t>, std::basic_string_view<wchar_t>>]"
                 );
  }
  local_29 = 0;
  local_28 = in_RCX;
  this_00 = (regexp_literal_expression *)operator_new(0x50);
  position_stack_node::extend(&local_48,(position_stack_node *)args[6]._M_str);
  pattern._M_len = args_local_1->_M_len;
  pattern._M_str = args_local_1->_M_str;
  regexp_literal_expression::regexp_literal_expression(this_00,&local_48,pattern,*local_28);
  std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>::
  unique_ptr<std::default_delete<mjs::expression>,void>
            ((unique_ptr<mjs::expression,std::default_delete<mjs::expression>> *)this,
             (pointer)this_00);
  source_extend::~source_extend(&local_48);
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr make_expression(Args&&... args) {
        assert(expression_pos_);
        auto e = expression_ptr{new T{expression_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << e->extend() << " Producting: " << *e << "\n";
#endif
        return e;
    }